

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::SegmentInfo::Write(SegmentInfo *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64 uVar7;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  if ((this->muxing_app_ != (char *)0x0) && (this->writing_app_ != (char *)0x0)) {
    uVar4 = EbmlElementSize(0x2ad7b1,this->timecode_scale_);
    if (0.0 < this->duration_) {
      uVar5 = EbmlElementSize(0x4489,(float)this->duration_);
      uVar4 = uVar4 + uVar5;
    }
    uVar5 = EbmlDateElementSize(0x4461);
    uVar6 = EbmlElementSize(0x4d80,this->muxing_app_);
    uVar7 = EbmlElementSize(0x5741,this->writing_app_);
    uVar7 = uVar7 + uVar6 + uVar4 + uVar5;
    bVar1 = WriteEbmlMasterElement(writer,0x1549a966,uVar7);
    if (bVar1) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if ((-1 < extraout_var) &&
         (bVar1 = WriteEbmlElement(writer,0x2ad7b1,this->timecode_scale_), bVar1)) {
        if (0.0 < this->duration_) {
          iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
          this->duration_pos_ = CONCAT44(extraout_var_00,iVar3);
          bVar1 = WriteEbmlElement(writer,0x4489,(float)this->duration_);
          if (!bVar1) {
            return false;
          }
        }
        if (this->date_utc_ != -0x8000000000000000) {
          WriteEbmlDateElement(writer,0x4461,this->date_utc_);
        }
        bVar1 = WriteEbmlElement(writer,0x4d80,this->muxing_app_);
        if ((bVar1) && (bVar1 = WriteEbmlElement(writer,0x5741,this->writing_app_), bVar1)) {
          iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
          return CONCAT44(extraout_var_01,iVar3) - CONCAT44(extraout_var,iVar2) == uVar7 &&
                 -1 < extraout_var_01;
        }
      }
    }
  }
  return false;
}

Assistant:

bool SegmentInfo::Write(IMkvWriter* writer) {
  if (!writer || !muxing_app_ || !writing_app_)
    return false;

  uint64_t size = EbmlElementSize(libwebm::kMkvTimecodeScale,
                                  static_cast<uint64>(timecode_scale_));
  if (duration_ > 0.0)
    size +=
        EbmlElementSize(libwebm::kMkvDuration, static_cast<float>(duration_));
  if (date_utc_ != LLONG_MIN)
    size += EbmlDateElementSize(libwebm::kMkvDateUTC);
  size += EbmlElementSize(libwebm::kMkvMuxingApp, muxing_app_);
  size += EbmlElementSize(libwebm::kMkvWritingApp, writing_app_);

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvInfo, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvTimecodeScale,
                        static_cast<uint64>(timecode_scale_)))
    return false;

  if (duration_ > 0.0) {
    // Save for later
    duration_pos_ = writer->Position();

    if (!WriteEbmlElement(writer, libwebm::kMkvDuration,
                          static_cast<float>(duration_)))
      return false;
  }

  if (date_utc_ != LLONG_MIN)
    WriteEbmlDateElement(writer, libwebm::kMkvDateUTC, date_utc_);

  if (!WriteEbmlElement(writer, libwebm::kMkvMuxingApp, muxing_app_))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvWritingApp, writing_app_))
    return false;

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}